

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh_factories.cpp
# Opt level: O1

tuple<std::unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>,_std::unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>,_std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>_>
* geometrycentral::surface::makeSurfaceMeshAndGeometry
            (tuple<std::unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>,_std::unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>,_std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>_>
             *__return_storage_ptr__,
            vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *polygons,
            vector<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>_>
            *twins,vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>
                   *vertexPositions,
            vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
            *paramCoordinates)

{
  undefined8 *puVar1;
  Vector2 *pVVar2;
  size_t sVar3;
  pointer pVVar4;
  Vector3 *pVVar5;
  pointer pvVar6;
  long lVar7;
  double dVar8;
  _Head_base<0UL,_geometrycentral::surface::SurfaceMesh_*,_false> this;
  _Head_base<0UL,_geometrycentral::surface::VertexPositionGeometry_*,_false> this_00;
  __uniq_ptr_data<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>,_true,_true>
  this_01;
  ulong uVar9;
  size_t sVar10;
  long *plVar11;
  size_t sVar12;
  long lVar13;
  pointer pVVar14;
  ulong uVar15;
  
  if ((twins->
      super__Vector_base<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (twins->
      super__Vector_base<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    this._M_head_impl = (SurfaceMesh *)operator_new(0x308);
    SurfaceMesh::SurfaceMesh(this._M_head_impl,polygons);
  }
  else {
    this._M_head_impl = (SurfaceMesh *)operator_new(0x308);
    SurfaceMesh::SurfaceMesh(this._M_head_impl,polygons,twins);
  }
  this_00._M_head_impl = (VertexPositionGeometry *)operator_new(0x1880);
  VertexPositionGeometry::VertexPositionGeometry(this_00._M_head_impl,this._M_head_impl);
  sVar3 = (this._M_head_impl)->nVerticesFillCount;
  if ((sVar3 == 0) ||
     (plVar11 = *(long **)&((this._M_head_impl)->vHalfedgeArr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
     , *plVar11 != -1)) {
    sVar10 = 0;
  }
  else {
    sVar12 = 0;
    do {
      sVar10 = sVar3;
      if (sVar3 - 1 == sVar12) break;
      sVar10 = sVar12 + 1;
      lVar13 = sVar12 + 1;
      sVar12 = sVar10;
    } while (plVar11[lVar13] == -1);
  }
  if (sVar10 != sVar3) {
    do {
      pVVar4 = (vertexPositions->
               super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pVVar5 = (((DATA_T *)((long)&(this_00._M_head_impl)->super_EmbeddedGeometryInterface + 0x1538)
                )->super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector3,__1,_1,_0,__1,_1>_>)
               .m_storage.m_data;
      pVVar5[sVar10].z = pVVar4[sVar10].z;
      pVVar4 = pVVar4 + sVar10;
      dVar8 = pVVar4->y;
      pVVar5 = pVVar5 + sVar10;
      pVVar5->x = pVVar4->x;
      pVVar5->y = dVar8;
      sVar12 = sVar10;
      do {
        sVar10 = sVar3;
        if (sVar3 - 1 == sVar12) break;
        sVar10 = sVar12 + 1;
        lVar13 = sVar12 * 8;
        sVar12 = sVar10;
      } while (*(long *)(*(long *)&((this._M_head_impl)->vHalfedgeArr).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl + 8 + lVar13) == -1);
    } while (sVar10 != sVar3);
  }
  this_01.
  super___uniq_ptr_impl<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_*,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
  .
  super__Head_base<0UL,_geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_impl<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
        )operator_new(0x40);
  MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>::MeshData
            ((MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2> *)
             this_01.
             super___uniq_ptr_impl<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_*,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
             .
             super__Head_base<0UL,_geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_*,_false>
             ._M_head_impl,this._M_head_impl);
  if ((((long)(paramCoordinates->
              super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(paramCoordinates->
              super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
       (this._M_head_impl)->nFacesCount == 0) && ((this._M_head_impl)->nFacesCount != 0)) {
    uVar9 = 0;
    do {
      pvVar6 = (paramCoordinates->
               super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pVVar14 = pvVar6[uVar9].
                super__Vector_base<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar6[uVar9].
                   super__Vector_base<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>
                   ._M_impl.super__Vector_impl_data + 8) != pVVar14) {
        plVar11 = (long *)(uVar9 * 8 +
                          *(long *)&((this._M_head_impl)->fHalfedgeArr).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl);
        lVar13 = 0;
        uVar15 = 0;
        do {
          lVar7 = *plVar11;
          puVar1 = (undefined8 *)((long)&pVVar14->x + lVar13);
          dVar8 = (double)puVar1[1];
          pVVar2 = (((DATA_T *)
                    ((long)this_01.
                           super___uniq_ptr_impl<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_*,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
                           .
                           super__Head_base<0UL,_geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_*,_false>
                           ._M_head_impl + 0x18))->
                   super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>)
                   .m_storage.m_data + lVar7;
          pVVar2->x = (double)*puVar1;
          pVVar2->y = dVar8;
          plVar11 = (long *)(lVar7 * 8 +
                            *(long *)&((this._M_head_impl)->heNextArr).
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl);
          uVar15 = uVar15 + 1;
          pvVar6 = (paramCoordinates->
                   super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pVVar14 = pvVar6[uVar9].
                    super__Vector_base<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar13 = lVar13 + 0x10;
        } while (uVar15 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar6[uVar9].
                                                 super__Vector_base<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                  (long)pVVar14 >> 4));
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (this._M_head_impl)->nFacesCount);
  }
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>,_std::unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>,_std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>_>
  ).
  super__Tuple_impl<1UL,_std::unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>,_std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>_>
  .
  super__Tuple_impl<2UL,_std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>_>
  .
  super__Head_base<2UL,_std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>,_false>
  ._M_head_impl._M_t.
  super___uniq_ptr_impl<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
       = this_01.
         super___uniq_ptr_impl<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_*,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
         .
         super__Head_base<0UL,_geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_*,_false>
         ._M_head_impl;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>,_std::unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>,_std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>_>
  ).
  super__Tuple_impl<1UL,_std::unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>,_std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>_>
  .
  super__Head_base<1UL,_std::unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>,_false>
  ._M_head_impl._M_t.
  super___uniq_ptr_impl<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>
  ._M_t.
  super__Tuple_impl<0UL,_geometrycentral::surface::VertexPositionGeometry_*,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>
  .super__Head_base<0UL,_geometrycentral::surface::VertexPositionGeometry_*,_false>._M_head_impl =
       this_00._M_head_impl;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>,_std::unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>,_std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>_>
  ).
  super__Head_base<0UL,_std::unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>,_false>
  ._M_head_impl._M_t.
  super___uniq_ptr_impl<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>
  ._M_t.
  super__Tuple_impl<0UL,_geometrycentral::surface::SurfaceMesh_*,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>
  .super__Head_base<0UL,_geometrycentral::surface::SurfaceMesh_*,_false>._M_head_impl =
       this._M_head_impl;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<std::unique_ptr<SurfaceMesh>, std::unique_ptr<VertexPositionGeometry>, std::unique_ptr<CornerData<Vector2>>>
makeSurfaceMeshAndGeometry(const std::vector<std::vector<size_t>>& polygons,
                           const std::vector<std::vector<std::tuple<size_t, size_t>>>& twins,
                           const std::vector<Vector3> vertexPositions,
                           const std::vector<std::vector<Vector2>>& paramCoordinates) {

  // Construct
  std::unique_ptr<SurfaceMesh> mesh;
  if (twins.empty()) {
    mesh.reset(new SurfaceMesh(polygons));
  } else {
    mesh.reset(new SurfaceMesh(polygons, twins));
  }
  std::unique_ptr<VertexPositionGeometry> geometry(new VertexPositionGeometry(*mesh));
  for (Vertex v : mesh->vertices()) {
    // Use the low-level indexers here since we're constructing
    (*geometry).vertexPositions[v] = vertexPositions[v.getIndex()];
  }

  std::unique_ptr<CornerData<Vector2>> parameterization(new CornerData<Vector2>(*mesh));
  if (paramCoordinates.size() == mesh->nFaces()) {
    for (size_t i = 0; i < mesh->nFaces(); i++) {
      Halfedge h = mesh->face(i).halfedge();
      for (size_t j = 0; j < paramCoordinates[i].size(); j++) {
        (*parameterization)[h.corner()] = paramCoordinates[i][j];
        h = h.next();
      }
    }
  }

  return std::make_tuple(std::move(mesh), std::move(geometry), std::move(parameterization));
}